

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,SPxId *enterId)

{
  int i;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  int *piVar3;
  int iVar4;
  DataKey DVar5;
  long lVar6;
  pointer pnVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  long lVar10;
  byte bVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [13];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  fpclass_type local_c0;
  int32_t iStack_bc;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar11 = 0;
  local_138 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_cb = 0;
  lVar10 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->infeasibilitiesCo).super_IdxSet.num;
  if (0 < lVar10) {
    lVar10 = lVar10 + 1;
    do {
      pSVar1 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      i = (pSVar1->infeasibilitiesCo).super_IdxSet.idx[lVar10 + -2];
      pnVar2 = (pSVar1->theTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar7 = pnVar2 + i;
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)local_138;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar9->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar11 * -2 + 1) * 4);
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
      }
      iStack_c8 = pnVar2[i].m_backend.exp;
      bStack_c4 = pnVar2[i].m_backend.neg;
      local_c0 = pnVar2[i].m_backend.fpclass;
      iStack_bc = pnVar2[i].m_backend.prec_elem;
      pnVar8 = &(this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thetolerance;
      pcVar9 = &local_b0;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar9->data)._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
        pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar8 + (ulong)bVar11 * -8 + 4);
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
      }
      local_b0.exp = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.exp;
      local_b0.neg = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.neg;
      local_b0.fpclass =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.fpclass;
      local_b0.prec_elem =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.prec_elem;
      if (local_b0.data._M_elems[0] != 0 || local_b0.fpclass != cpp_dec_float_finite) {
        local_b0.neg = (bool)(local_b0.neg ^ 1);
      }
      if ((local_b0.fpclass == cpp_dec_float_NaN || local_c0 == cpp_dec_float_NaN) ||
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_138,&local_b0), -1 < iVar4)) {
        pSVar1 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        piVar3 = (pSVar1->infeasibilitiesCo).super_IdxSet.idx;
        iVar4 = (pSVar1->infeasibilitiesCo).super_IdxSet.num;
        (pSVar1->infeasibilitiesCo).super_IdxSet.num = iVar4 + -1;
        piVar3[lVar10 + -2] = piVar3[(long)iVar4 + -1];
        (pSVar1->isInfeasibleCo).data[i] = 0;
      }
      else if (((local_c0 != cpp_dec_float_NaN) && ((best->m_backend).fpclass != cpp_dec_float_NaN))
              && (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_138,&best->m_backend),
                 iVar4 < 0)) {
        DVar5 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::id((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,i);
        enterId->super_DataKey = DVar5;
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)local_138;
        pnVar8 = best;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pnVar8->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
          pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar8 + ((ulong)bVar11 * -2 + 1) * 4);
        }
        (best->m_backend).exp = iStack_c8;
        (best->m_backend).neg = bStack_c4;
        (best->m_backend).fpclass = local_c0;
        (best->m_backend).prec_elem = iStack_bc;
      }
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterSparseCoDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = this->thesolver->test()[idx];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId = this->thesolver->id(idx);
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         assert(this->thesolver->isInfeasibleCo[idx] > 0);
         this->thesolver->isInfeasibleCo[idx] = 0;
      }
   }

   return enterId;
}